

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O0

void anon_unknown.dwarf_89c5::testDenormalizedRounding(int n)

{
  ushort extraout_AX;
  ostream *poVar1;
  int in_EDI;
  float fVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  float e;
  half r;
  half h;
  int i;
  float eMax;
  float eExpected;
  float in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  float in_stack_ffffffffffffffe4;
  half local_16;
  unsigned_short local_14;
  half local_12;
  uint local_10;
  float local_c;
  float local_8;
  int local_4;
  
  local_4 = in_EDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"rounding denormalized numbers to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  std::operator<<(poVar1,"-bit precision\n");
  if (local_4 < 10) {
    local_8 = (float)(1 << (10U - (char)local_4 & 0x1f)) * 2.9802322e-08;
  }
  else {
    local_8 = 0.0;
  }
  local_c = 0.0;
  local_10 = 0;
  while( true ) {
    if (199999 < (int)local_10) {
      poVar1 = std::operator<<((ostream *)&std::cout,"max error          = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"max expected error = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"ok\n\n");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
      return;
    }
    drand();
    half::half((half *)CONCAT44(in_stack_ffffffffffffffe4,
                                CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffdc);
    __x = extraout_XMM0_Qa;
    if ((local_10 & 1) != 0) {
      local_14 = (unsigned_short)half::operator-(&local_12);
      __x = extraout_XMM0_Qa_00;
      local_12 = (half)local_14;
    }
    half::round(&local_12,__x);
    local_16._h = extraout_AX;
    in_stack_ffffffffffffffe4 = half::operator_cast_to_float(&local_16);
    fVar2 = half::operator_cast_to_float(&local_12);
    in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 - fVar2;
    if (in_stack_ffffffffffffffe4 < 0.0) {
      in_stack_ffffffffffffffe4 = -in_stack_ffffffffffffffe4;
    }
    if (local_8 < in_stack_ffffffffffffffe4) break;
    if (local_c < in_stack_ffffffffffffffe4) {
      local_c = in_stack_ffffffffffffffe4;
    }
    local_10 = local_10 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"half = ");
  poVar1 = (ostream *)operator<<(poVar1,(half *)(ulong)local_12._h);
  poVar1 = std::operator<<(poVar1,", rounded = ");
  poVar1 = (ostream *)operator<<(poVar1,(half *)(ulong)local_16._h);
  poVar1 = std::operator<<(poVar1,", error = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_ffffffffffffffe4);
  poVar1 = std::operator<<(poVar1,", expected error = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printBits((ostream *)&std::cout,(half *)(ulong)local_12._h);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  printBits((ostream *)&std::cout,(half *)(ulong)local_16._h);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testError.cpp"
                ,0xc6,"void (anonymous namespace)::testDenormalizedRounding(int)");
}

Assistant:

void
testDenormalizedRounding (int n)
{
    cout << "rounding denormalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10)? HALF_MIN * 0.5f * (1 << (10 - n)): 0;
    float eMax = 0;

    for (int i = 0; i < 200000; i++)
    {
	half h (drand() * (HALF_NRM_MIN - HALF_MIN));

	if (i & 1)
	    h = -h;

	half r (h.round(n));
	float e = r - h;

	if (e < 0)
	    e = -e;

	if (e > eExpected)
	{
	    cout << "half = " << h <<
		    ", rounded = " << r <<
		    ", error = " << e <<
		    ", expected error = " << eExpected << endl;

	    printBits (cout, h);
	    cout << endl;
	    printBits (cout, r);
	    cout << endl;

	    assert (false);
	}

	if (e > eMax)
	    eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}